

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitOperand
          (InstructionDisassembler *this,ostream *stream,spv_parsed_instruction_t *inst,
          uint16_t operand_index)

{
  spv_parsed_operand_t *operand;
  Op opcode;
  spv_parsed_operand_t *psVar1;
  char *__s;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  spv_result_t sVar5;
  size_t sVar6;
  spv_operand_type_t type;
  size_type sVar7;
  spv_operand_desc entry;
  Op local_54;
  undefined1 local_50 [32];
  
  if (inst->num_operands <= operand_index) {
    __assert_fail("operand_index < inst.num_operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                  ,0x358,
                  "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                 );
  }
  psVar1 = inst->operands;
  operand = psVar1 + operand_index;
  opcode = inst->words[psVar1[operand_index].offset];
  type = psVar1[operand_index].type;
  switch(type) {
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_TYPE_ID:
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
  case SPV_OPERAND_TYPE_SCOPE_ID:
    SetYellow(this,stream);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"%",1);
    local_54 = opcode;
    if ((this->name_mapper_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->name_mapper_)._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (_Any_data *)&this->name_mapper_,&local_54);
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_50._0_8_,local_50._8_8_)
    ;
    goto LAB_001b2e71;
  case SPV_OPERAND_TYPE_RESULT_ID:
    __assert_fail("false && \"<result-id> is not supposed to be handled here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                  ,0x35d,
                  "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                 );
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    SetRed(this,stream);
    EmitNumericLiteral(stream,inst,operand);
    ResetColor(this,stream);
    break;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    SetRed(this,stream);
    sVar5 = AssemblyGrammar::lookupExtInst
                      (this->grammar_,inst->ext_inst_type,opcode,(spv_ext_inst_desc *)local_50);
    if (sVar5 != SPV_SUCCESS) {
      bVar4 = spvExtInstIsNonSemantic(inst->ext_inst_type);
      if (!bVar4) {
        __assert_fail("false && \"should have caught this earlier\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                      ,0x370,
                      "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                     );
      }
      std::ostream::_M_insert<unsigned_long>((ulong)stream);
      break;
    }
    goto LAB_001b2eca;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    sVar5 = AssemblyGrammar::lookupOpcode(this->grammar_,opcode,(spv_opcode_desc *)local_50);
    if (sVar5 != SPV_SUCCESS) {
      __assert_fail("false && \"should have caught this earlier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x37a,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    SetRed(this,stream);
    goto LAB_001b2eca;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    SetGreen(this,stream);
    spvDecodeLiteralStringOperand_abi_cxx11_((string *)local_50,inst,operand_index);
    uVar2 = local_50._0_8_;
    if (local_50._8_8_ != 0) {
      sVar7 = 0;
      do {
        cVar3 = *(char *)(uVar2 + sVar7);
        if ((cVar3 == '\\') || (cVar3 == '\"')) {
          local_54 = CONCAT31(local_54._1_3_,0x5c);
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_54,1);
          cVar3 = *(char *)(uVar2 + sVar7);
        }
        local_54 = CONCAT31(local_54._1_3_,cVar3);
        std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_54,1);
        sVar7 = sVar7 + 1;
      } while (local_50._8_8_ != sVar7);
    }
    ResetColor(this,stream);
    local_54 = CONCAT31(local_54._1_3_,0x22);
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_54,1);
LAB_001b2e71:
    if ((spv_operand_desc)local_50._0_8_ != (spv_operand_desc)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
    }
    break;
  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
  case SPV_OPERAND_TYPE_MEMORY_MODEL:
  case SPV_OPERAND_TYPE_EXECUTION_MODE:
  case SPV_OPERAND_TYPE_STORAGE_CLASS:
  case SPV_OPERAND_TYPE_DIMENSIONALITY:
  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
  case SPV_OPERAND_TYPE_DECORATION:
  case SPV_OPERAND_TYPE_BUILT_IN:
  case SPV_OPERAND_TYPE_GROUP_OPERATION:
  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
  case SPV_OPERAND_TYPE_CAPABILITY:
  case SPV_OPERAND_TYPE_FPENCODING:
  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
  case SPV_OPERAND_TYPE_FPDENORM_MODE:
  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
  case SPV_OPERAND_TYPE_RAY_FLAGS:
  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
    sVar5 = AssemblyGrammar::lookupOperand(this->grammar_,type,opcode,(spv_operand_desc *)local_50);
    if (sVar5 != SPV_SUCCESS) {
      __assert_fail("false && \"should have caught this earlier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x3b9,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    __s = *(char **)local_50._0_8_;
    if (__s == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar6);
    }
    break;
  default:
    bVar4 = spvOperandIsConcreteMask(type);
    type = operand->type;
    if (bVar4) goto LAB_001b2cb4;
    bVar4 = spvOperandIsConcrete(type);
    if (!bVar4) {
      __assert_fail("false && \"unhandled or invalid case\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x3d0,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
    sVar5 = AssemblyGrammar::lookupOperand
                      (this->grammar_,operand->type,opcode,(spv_operand_desc *)local_50);
    if (sVar5 != SPV_SUCCESS) {
      __assert_fail("false && \"should have caught this earlier\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                    ,0x3cd,
                    "void spvtools::disassemble::InstructionDisassembler::EmitOperand(std::ostream &, const spv_parsed_instruction_t &, const uint16_t) const"
                   );
    }
LAB_001b2eca:
    std::operator<<(stream,*(char **)local_50._0_8_);
    break;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
LAB_001b2cb4:
    EmitMaskOperand(this,stream,type,opcode);
  }
  ResetColor(this,stream);
  return;
}

Assistant:

void InstructionDisassembler::EmitOperand(std::ostream& stream,
                                          const spv_parsed_instruction_t& inst,
                                          const uint16_t operand_index) const {
  assert(operand_index < inst.num_operands);
  const spv_parsed_operand_t& operand = inst.operands[operand_index];
  const uint32_t word = inst.words[operand.offset];
  switch (operand.type) {
    case SPV_OPERAND_TYPE_RESULT_ID:
      assert(false && "<result-id> is not supposed to be handled here");
      SetBlue(stream);
      stream << "%" << name_mapper_(word);
      break;
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      SetYellow(stream);
      stream << "%" << name_mapper_(word);
      break;
    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER: {
      spv_ext_inst_desc ext_inst;
      SetRed(stream);
      if (grammar_.lookupExtInst(inst.ext_inst_type, word, &ext_inst) ==
          SPV_SUCCESS) {
        stream << ext_inst->name;
      } else {
        if (!spvExtInstIsNonSemantic(inst.ext_inst_type)) {
          assert(false && "should have caught this earlier");
        } else {
          // for non-semantic instruction sets we can just print the number
          stream << word;
        }
      }
    } break;
    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER: {
      spv_opcode_desc opcode_desc;
      if (grammar_.lookupOpcode(spv::Op(word), &opcode_desc))
        assert(false && "should have caught this earlier");
      SetRed(stream);
      stream << opcode_desc->name;
    } break;
    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
    case SPV_OPERAND_TYPE_LITERAL_FLOAT: {
      SetRed(stream);
      EmitNumericLiteral(&stream, inst, operand);
      ResetColor(stream);
    } break;
    case SPV_OPERAND_TYPE_LITERAL_STRING: {
      stream << "\"";
      SetGreen(stream);

      std::string str = spvDecodeLiteralStringOperand(inst, operand_index);
      for (char const& c : str) {
        if (c == '"' || c == '\\') stream << '\\';
        stream << c;
      }
      ResetColor(stream);
      stream << '"';
    } break;
    case SPV_OPERAND_TYPE_CAPABILITY:
    case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
    case SPV_OPERAND_TYPE_EXECUTION_MODEL:
    case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
    case SPV_OPERAND_TYPE_MEMORY_MODEL:
    case SPV_OPERAND_TYPE_EXECUTION_MODE:
    case SPV_OPERAND_TYPE_STORAGE_CLASS:
    case SPV_OPERAND_TYPE_DIMENSIONALITY:
    case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
    case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
    case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
    case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
    case SPV_OPERAND_TYPE_LINKAGE_TYPE:
    case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
    case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
    case SPV_OPERAND_TYPE_DECORATION:
    case SPV_OPERAND_TYPE_BUILT_IN:
    case SPV_OPERAND_TYPE_GROUP_OPERATION:
    case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
    case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
    case SPV_OPERAND_TYPE_RAY_FLAGS:
    case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
    case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
    case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
    case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
    case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
    case SPV_OPERAND_TYPE_DEBUG_OPERATION:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
    case SPV_OPERAND_TYPE_FPDENORM_MODE:
    case SPV_OPERAND_TYPE_FPOPERATION_MODE:
    case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
    case SPV_OPERAND_TYPE_FPENCODING:
    case SPV_OPERAND_TYPE_OVERFLOW_MODES: {
      spv_operand_desc entry;
      if (grammar_.lookupOperand(operand.type, word, &entry))
        assert(false && "should have caught this earlier");
      stream << entry->name;
    } break;
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
      EmitMaskOperand(stream, operand.type, word);
      break;
    default:
      if (spvOperandIsConcreteMask(operand.type)) {
        EmitMaskOperand(stream, operand.type, word);
      } else if (spvOperandIsConcrete(operand.type)) {
        spv_operand_desc entry;
        if (grammar_.lookupOperand(operand.type, word, &entry))
          assert(false && "should have caught this earlier");
        stream << entry->name;
      } else {
        assert(false && "unhandled or invalid case");
      }
      break;
  }
  ResetColor(stream);
}